

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O1

void glfwMakeContextCurrent(GLFWwindow *handle)

{
  _GLFWwindow *p_Var1;
  int error;
  
  p_Var1 = _glfwPlatformGetCurrentContext();
  if (_glfwInitialized == 0) {
    error = 0x10001;
  }
  else {
    if ((handle == (GLFWwindow *)0x0) || (*(int *)(handle + 0x1f0) != 0)) {
      if ((p_Var1 != (_GLFWwindow *)0x0) &&
         ((handle == (GLFWwindow *)0x0 || (*(int *)(handle + 500) != (p_Var1->context).source)))) {
        (*(p_Var1->context).makeCurrent)((_GLFWwindow *)0x0);
      }
      if (handle != (GLFWwindow *)0x0) {
        (**(code **)(handle + 0x238))(handle);
        return;
      }
      return;
    }
    error = 0x1000a;
  }
  _glfwInputError(error,(char *)0x0);
  return;
}

Assistant:

GLFWAPI void glfwMakeContextCurrent(GLFWwindow* handle)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    _GLFWwindow* previous = _glfwPlatformGetCurrentContext();

    _GLFW_REQUIRE_INIT();

    if (window && window->context.client == GLFW_NO_API)
    {
        _glfwInputError(GLFW_NO_WINDOW_CONTEXT, NULL);
        return;
    }

    if (previous)
    {
        if (!window || window->context.source != previous->context.source)
            previous->context.makeCurrent(NULL);
    }

    if (window)
        window->context.makeCurrent(window);
}